

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O0

gene_t __thiscall Chromosome::get_allele(Chromosome *this,size_t gene,size_t bstart)

{
  ulong uVar1;
  const_reference __rhs;
  allocator local_49;
  string local_48 [32];
  size_t local_28;
  size_t bstart_local;
  size_t gene_local;
  Chromosome *this_local;
  gene_t tmp;
  
  uVar1 = this->ALLELE_SIZE;
  local_28 = bstart;
  bstart_local = gene;
  gene_local = (size_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,uVar1,'1',&local_49);
  std::bitset<50ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
            ((bitset<50ul> *)&this_local,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,0);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::bitset<50UL>::operator<<=((bitset<50UL> *)&this_local,local_28);
  __rhs = std::vector<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>::operator[]
                    (&this->genes,bstart_local);
  std::bitset<50UL>::operator&=((bitset<50UL> *)&this_local,__rhs);
  std::bitset<50UL>::operator>>=((bitset<50UL> *)&this_local,local_28);
  return (gene_t)(_Base_bitset<1UL>)this_local;
}

Assistant:

Chromosome::gene_t Chromosome::get_allele( size_t gene, size_t bstart ) const
{
	gene_t tmp(std::string(ALLELE_SIZE, '1'));
	tmp <<= bstart;
	tmp &= genes[gene];
	tmp >>= bstart;

	return tmp;
}